

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_not_vec_mipsel(TCGContext_conflict4 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a)

{
  TCGv_vec b;
  TCGv_vec pTVar1;
  uintptr_t o;
  
  pTVar1 = r;
  b = tcg_const_ones_vec_matching_mipsel(tcg_ctx,r);
  tcg_gen_xor_vec_mipsel(tcg_ctx,(uint)pTVar1,r,a,b);
  tcg_temp_free_internal_mipsel(tcg_ctx,(TCGTemp *)(b + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_not_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a)
{
    const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);

    if (!TCG_TARGET_HAS_not_vec || !do_op2(tcg_ctx, vece, r, a, INDEX_op_not_vec)) {
        TCGv_vec t = tcg_const_ones_vec_matching(tcg_ctx, r);
        tcg_gen_xor_vec(tcg_ctx, 0, r, a, t);
        tcg_temp_free_vec(tcg_ctx, t);
    }
    tcg_swap_vecop_list(hold_list);
}